

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>
               (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
                *source)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  vector<int,_std::allocator<int>_> *source_00;
  vector<int,_std::allocator<int>_> *source_01;
  vector<int,_std::allocator<int>_> *source_02;
  vector<int,_std::allocator<int>_> *source_03;
  vector<int,_std::allocator<int>_> *source_04;
  int local_dfc [2];
  anon_class_1_0_00000001 local_df4;
  anon_class_1_0_00000001_for_filter local_df3;
  anon_class_1_0_00000001 local_df2;
  anon_class_1_0_00000001_for_filter local_df1;
  IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_df0;
  IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_d30;
  IEnumerable<int> local_c70;
  IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_c58;
  allocator<int> local_bb9;
  int local_bb8 [8];
  iterator local_b98;
  size_type local_b90;
  vector<int,_std::allocator<int>_> local_b88;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_b70;
  IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_b40;
  allocator<int> local_a89;
  int local_a88 [8];
  iterator local_a68;
  size_type local_a60;
  vector<int,_std::allocator<int>_> local_a58;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_a40;
  IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_a10;
  allocator<int> local_959;
  int local_958 [8];
  iterator local_938;
  size_type local_930;
  vector<int,_std::allocator<int>_> local_928;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_910;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_8e0;
  allocator<int> local_829;
  int local_828 [8];
  iterator local_808;
  size_type local_800;
  vector<int,_std::allocator<int>_> local_7f8;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_7e0;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_7b0;
  allocator<int> local_6f9;
  int local_6f8 [6];
  iterator local_6e0;
  size_type local_6d8;
  vector<int,_std::allocator<int>_> local_6d0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_6b8;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_688;
  anon_class_1_0_00000001_for_filter local_5d2;
  anon_class_1_0_00000001 local_5d1;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  local_5d0;
  OUT local_530;
  anon_class_1_0_00000001 local_509;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  local_508;
  OUT local_468;
  anon_class_1_0_00000001 local_441;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  local_440;
  anon_class_1_0_00000001_for_filter local_399;
  IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
  local_398;
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>_>
  local_348;
  anon_class_1_0_00000001_for_filter local_2d9;
  IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
  local_2d8;
  anon_class_1_0_00000001_for_filter local_281;
  IEnumerableCore<linq::SkipWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>_>
  local_280;
  anon_class_1_0_00000001_for_filter local_229;
  IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>_>
  local_228;
  anon_class_1_0_00000001_for_filter local_1d1;
  IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>_>
  local_1d0;
  IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  local_180;
  IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  local_128;
  IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  local_d0;
  IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  local_68;
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_> *local_10
  ;
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
  *source_local;
  
  local_10 = source;
  iVar2 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          Min(source);
  assertEquals<int,int>(3,iVar2);
  iVar2 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          Max(source);
  assertEquals<int,int>(10,iVar2);
  sVar3 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          Count(source);
  assertEquals<int,unsigned_long>(8,sVar3);
  iVar2 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          Sum(source);
  assertEquals<int,int>(0x34,iVar2);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
  Take(&local_68,source,3);
  iVar2 = linq::
          IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
          ::Min(&local_68);
  assertEquals<int,int>(3,iVar2);
  linq::
  IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  ::~IEnumerableCore(&local_68);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
  Take(&local_d0,source,3);
  iVar2 = linq::
          IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
          ::Max(&local_d0);
  assertEquals<int,int>(5,iVar2);
  linq::
  IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  ::~IEnumerableCore(&local_d0);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
  Skip(&local_128,source,3);
  iVar2 = linq::
          IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
          ::Min(&local_128);
  assertEquals<int,int>(6,iVar2);
  linq::
  IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  ::~IEnumerableCore(&local_128);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
  Skip(&local_180,source,3);
  iVar2 = linq::
          IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
          ::Max(&local_180);
  assertEquals<int,int>(10,iVar2);
  linq::
  IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
  ::~IEnumerableCore(&local_180);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  TakeWhile<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_1_>
            (&local_1d0,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_1d1);
  iVar2 = linq::
          IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>_>
          ::Min(&local_1d0);
  assertEquals<int,int>(3,iVar2);
  linq::
  IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>_>
  ::~IEnumerableCore(&local_1d0);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  TakeWhile<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_2_>
            (&local_228,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_229);
  iVar2 = linq::
          IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>_>
          ::Max(&local_228);
  assertEquals<int,int>(4,iVar2);
  linq::
  IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>_>
  ::~IEnumerableCore(&local_228);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  SkipWhile<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_3_>
            (&local_280,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_281);
  iVar2 = linq::
          IEnumerableCore<linq::SkipWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>_>
          ::Min(&local_280);
  assertEquals<int,int>(5,iVar2);
  linq::
  IEnumerableCore<linq::SkipWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>_>
  ::~IEnumerableCore(&local_280);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Where<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_4_>
            (&local_2d8,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_2d9);
  sVar3 = linq::
          IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
          ::Count(&local_2d8);
  assertEquals<int,unsigned_long>(4,sVar3);
  linq::
  IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
  ::~IEnumerableCore(&local_2d8);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Where<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_5_>
            (&local_398,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_399);
  linq::
  IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::Skip(&local_348,&local_398,1);
  iVar2 = linq::
          IEnumerableCore<linq::SkipState<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>,_int>_>
          ::First(&local_348);
  assertEquals<int,int>(6,iVar2);
  linq::
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>,_int>_>
  ::~IEnumerableCore(&local_348);
  linq::
  IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::~IEnumerableCore(&local_398);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_6_>
            (&local_440,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_441);
  sVar3 = linq::
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
          ::Count(&local_440);
  assertEquals<int,unsigned_long>(2,sVar3);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  ::~IEnumerableCore(&local_440);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_7_>
            (&local_508,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_509);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  ::First(&local_468,&local_508);
  sVar3 = linq::IEnumerable<int_&>::Count(&local_468.super_IEnumerable<int_&>);
  assertEquals<int,unsigned_long>(6,sVar3);
  linq::IGrouping<bool,_int_&>::~IGrouping(&local_468);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  ::~IEnumerableCore(&local_508);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_8_>
            (&local_5d0,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_5d1);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  ::Last(&local_530,&local_5d0);
  sVar3 = linq::IEnumerable<int_&>::Count(&local_530.super_IEnumerable<int_&>);
  assertEquals<int,unsigned_long>(2,sVar3);
  linq::IGrouping<bool,_int_&>::~IGrouping(&local_530);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
  ::~IEnumerableCore(&local_5d0);
  iVar2 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
          Single<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_9_>
                    ((IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                      *)source,&local_5d2);
  assertEquals<int,int>(5,iVar2);
  local_6f8[0] = 1;
  local_6f8[1] = 5;
  local_6f8[2] = 6;
  local_6f8[3] = 7;
  local_6f8[4] = 5;
  local_6e0 = local_6f8;
  local_6d8 = 5;
  std::allocator<int>::allocator(&local_6f9);
  __l_03._M_len = local_6d8;
  __l_03._M_array = local_6e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_6d0,__l_03,&local_6f9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_6b8,(linq *)&local_6d0,source_00);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            (&local_688,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_6b8,source);
  iVar2 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Min(&local_688);
  assertEquals<int,int>(5,iVar2);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_688);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_6b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_6d0);
  std::allocator<int>::~allocator(&local_6f9);
  local_828[0] = 1;
  local_828[1] = 5;
  local_828[2] = 6;
  local_828[3] = 7;
  local_828[4] = 5;
  local_808 = local_828;
  local_800 = 5;
  std::allocator<int>::allocator(&local_829);
  __l_02._M_len = local_800;
  __l_02._M_array = local_808;
  std::vector<int,_std::allocator<int>_>::vector(&local_7f8,__l_02,&local_829);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_7e0,(linq *)&local_7f8,source_01);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            (&local_7b0,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_7e0,source);
  iVar2 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Max(&local_7b0);
  assertEquals<int,int>(7,iVar2);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_7b0);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_7e0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_7f8);
  std::allocator<int>::~allocator(&local_829);
  local_958[0] = 1;
  local_958[1] = 5;
  local_958[2] = 6;
  local_958[3] = 7;
  local_958[4] = 5;
  local_938 = local_958;
  local_930 = 5;
  std::allocator<int>::allocator(&local_959);
  __l_01._M_len = local_930;
  __l_01._M_array = local_938;
  std::vector<int,_std::allocator<int>_>::vector(&local_928,__l_01,&local_959);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_910,(linq *)&local_928,source_02);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            (&local_8e0,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_910,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_8e0);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_8e0);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_910);
  std::vector<int,_std::allocator<int>_>::~vector(&local_928);
  std::allocator<int>::~allocator(&local_959);
  local_a88[0] = 1;
  local_a88[1] = 5;
  local_a88[2] = 6;
  local_a88[3] = 7;
  local_a88[4] = 5;
  local_a68 = local_a88;
  local_a60 = 5;
  std::allocator<int>::allocator(&local_a89);
  __l_00._M_len = local_a60;
  __l_00._M_array = local_a68;
  std::vector<int,_std::allocator<int>_>::vector(&local_a58,__l_00,&local_a89);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_a40,(linq *)&local_a58,source_03);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Intersect<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            (&local_a10,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_a40);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_a10);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_a10);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_a40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a58);
  std::allocator<int>::~allocator(&local_a89);
  local_bb8[0] = 1;
  local_bb8[1] = 5;
  local_bb8[2] = 6;
  local_bb8[3] = 7;
  local_bb8[4] = 5;
  local_b98 = local_bb8;
  local_b90 = 5;
  std::allocator<int>::allocator(&local_bb9);
  __l._M_len = local_b90;
  __l._M_array = local_b98;
  std::vector<int,_std::allocator<int>_>::vector(&local_b88,__l,&local_bb9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_b70,(linq *)&local_b88,source_04);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Except<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            (&local_b40,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_b70);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_b40);
  assertEquals<int,unsigned_long>(5,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_b40);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_b70);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b88);
  std::allocator<int>::~allocator(&local_bb9);
  linq::IEnumerable<int>::Range(&local_c70,5,9);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Except<linq::IEnumerable<int>>
            (&local_c58,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,&local_c70);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_c58);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_c58);
  linq::IEnumerable<int>::~IEnumerable(&local_c70);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            (&local_d30,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_d30);
  assertEquals<int,unsigned_long>(8,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_d30);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Except<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            (&local_df0,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,source);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_df0);
  assertEquals<int,unsigned_long>(0,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_df0);
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          Any(source);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          All(source);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
          Any<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_10_>
                    ((IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                      *)source,&local_df1);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
          All<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_11_>
                    ((IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                      *)source,&local_df2);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
          Any<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_12_>
                    ((IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                      *)source,&local_df3);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
          All<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_13_>
                    ((IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                      *)source,&local_df4);
  assertEquals<bool,bool>(true,bVar1);
  local_dfc[1] = 6;
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          Contains<int>(source,local_dfc + 1);
  assertEquals<bool,bool>(true,bVar1);
  local_dfc[0] = 0x10;
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          Contains<int>(source,local_dfc);
  assertEquals<bool,bool>(false,bVar1);
  return;
}

Assistant:

void test(S source)
{
	assertEquals(    3, source.Min());
	assertEquals(   10, source.Max());
	assertEquals(    8, source.Count());
	assertEquals(   52, source.Sum());
	assertEquals(    3, source.Take(3).Min());
	assertEquals(    5, source.Take(3).Max());
	assertEquals(    6, source.Skip(3).Min());
	assertEquals(   10, source.Skip(3).Max());
	assertEquals(    3, source.TakeWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.TakeWhile([](int x){ return x < 5; }).Max());
	assertEquals(    5, source.SkipWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.Where([](int x){ return x < 7; }).Count());
	assertEquals(    6, source.Where([](int x){ return x % 3 == 0; }).Skip(1).First());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Count());
	assertEquals(    6, source.GroupBy([](int x){ return x < 5; }).First().Count());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Last().Count());
	assertEquals(    5, source.Single([](int x){ return x == 5; }));
	assertEquals(    5, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Min());
	assertEquals(    7, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Max());
	assertEquals(    3, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Count());
	assertEquals(    3, source.Intersect(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    5, source.Except(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    3, source.Except(IEnumerable<int>::Range(5,9)).Count());
	assertEquals(    8, source.Intersect(source).Count());
	assertEquals(    0, source.Except(source).Count());
	assertEquals( true, source.Any());
	assertEquals( true, source.All());
	assertEquals( true, source.Any([](int x) { return x > 9; }));
	assertEquals(false, source.All([](int x) { return x > 9; }));
	assertEquals(false, source.Any([](int x) { return x > 10; }));
	assertEquals( true, source.All([](int x) { return x <= 10; }));
	assertEquals( true, source.Contains(6));
	assertEquals(false, source.Contains(16));
}